

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

xmlNodePtr xmlXPtrGetNthChild(xmlNodePtr cur,int no)

{
  int local_20;
  int i;
  int no_local;
  xmlNodePtr cur_local;
  
  cur_local = cur;
  if ((cur != (xmlNodePtr)0x0) && (cur->type != XML_NAMESPACE_DECL)) {
    _i = cur->children;
    local_20 = 0;
    while (local_20 <= no) {
      if (_i == (_xmlNode *)0x0) {
        return (xmlNodePtr)0x0;
      }
      if ((((_i->type == XML_ELEMENT_NODE) || (_i->type == XML_DOCUMENT_NODE)) ||
          (_i->type == XML_HTML_DOCUMENT_NODE)) && (local_20 = local_20 + 1, local_20 == no)) break;
      _i = _i->next;
    }
    cur_local = _i;
  }
  return cur_local;
}

Assistant:

static xmlNodePtr
xmlXPtrGetNthChild(xmlNodePtr cur, int no) {
    int i;
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL))
	return(cur);
    cur = cur->children;
    for (i = 0;i <= no;cur = cur->next) {
	if (cur == NULL)
	    return(cur);
	if ((cur->type == XML_ELEMENT_NODE) ||
	    (cur->type == XML_DOCUMENT_NODE) ||
	    (cur->type == XML_HTML_DOCUMENT_NODE)) {
	    i++;
	    if (i == no)
		break;
	}
    }
    return(cur);
}